

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWrapper.cpp
# Opt level: O0

bool __thiscall LogWrapper::Write(LogWrapper *this,Location *location,int type,char *format,...)

{
  char *pcVar1;
  HANDLE pvVar2;
  FN_MLogWrite p_Var3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  undefined1 local_68 [8];
  string str;
  va_list args;
  char *format_local;
  int type_local;
  Location *location_local;
  LogWrapper *this_local;
  
  str.field_2._12_4_ = 0x30;
  str.field_2._8_4_ = 0x20;
  memset(this->m_buf,0,0x25800);
  dd::Location::ToString_abi_cxx11_((string *)local_68,location);
  uVar4 = std::__cxx11::string::length();
  if (uVar4 < 0x25800) {
    pcVar1 = this->m_buf;
    uVar5 = std::__cxx11::string::c_str();
    sprintf(pcVar1,"%s ",uVar5);
    pcVar1 = this->m_buf;
    lVar6 = std::__cxx11::string::length();
    lVar7 = std::__cxx11::string::length();
    vsnprintf(pcVar1 + lVar6 + 1,0x257ff - lVar7,format,(__gnuc_va_list)((long)&str.field_2 + 8));
    this->m_buf[0x257ff] = '\0';
    p_Var3 = s_write;
    if (s_write == (FN_MLogWrite)0x0) {
      this_local._7_1_ = false;
    }
    else {
      pvVar2 = this->m_hLog;
      pcVar1 = this->m_buf;
      sVar8 = strlen(pcVar1);
      this_local._7_1_ = (*p_Var3)(type,pvVar2,pcVar1,(unsigned_short)sVar8);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_68);
  return this_local._7_1_;
}

Assistant:

bool LogWrapper::Write(const dd::Location& location, int type,  const char *format, ... )
{
	va_list args;
	va_start(args, format);
	memset(m_buf, 0, MAX_BUF_SIZE);
	const std::string str = location.ToString();
	if (str.length() >= MAX_BUF_SIZE)
		return false;
	sprintf(m_buf, "%s ", str.c_str());
	vsnprintf(m_buf + str.length() + 1, MAX_BUF_SIZE - str.length() - 1, format, args);
	m_buf[MAX_BUF_SIZE - 1] = '\0';
	va_end(args);

	if(s_write != NULL)
		return	s_write(type, m_hLog, m_buf, strlen(m_buf));
	return false;
}